

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O1

ParsedIR * __thiscall diligent_spirv_cross::ParsedIR::operator=(ParsedIR *this,ParsedIR *other)

{
  SmallVector<diligent_spirv_cross::Variant,_8UL> *this_00;
  Variant *this_01;
  undefined4 uVar1;
  _Head_base<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_false> _Var2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  
  if (this != other) {
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&this->spirv,&other->spirv);
    ::std::
    _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>const,diligent_spirv_cross::Meta>,std::allocator<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>const,diligent_spirv_cross::Meta>>,std::__detail::_Select1st,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>const,diligent_spirv_cross::Meta>,std::allocator<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>const,diligent_spirv_cross::Meta>>,std::__detail::_Select1st,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>const,diligent_spirv_cross::Meta>,std::allocator<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>const,diligent_spirv_cross::Meta>>,std::__detail::_Select1st,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->meta,&(other->meta)._M_h);
    lVar5 = 0x130;
    do {
      SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::operator=
                ((SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *)
                 ((this->ids).stack_storage.aligned_char + lVar5 + -0x38),
                 (SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *)
                 ((other->ids).stack_storage.aligned_char + lVar5 + -0x38));
      lVar5 = lVar5 + 0x38;
    } while (lVar5 != 0x440);
    SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::operator=
              (&this->ids_for_constant_undef_or_type,&other->ids_for_constant_undef_or_type);
    SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::operator=
              (&this->ids_for_constant_or_variable,&other->ids_for_constant_or_variable);
    SmallVector<spv::Capability,_8UL>::operator=
              (&this->declared_capabilities,&other->declared_capabilities);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::operator=(&this->declared_extensions,&other->declared_extensions);
    SmallVector<unsigned_char,_8UL>::operator=(&this->block_meta,&other->block_meta);
    if (other != this) {
      ::std::
      _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>const,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>>,std::allocator<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>const,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>>>,std::__detail::_Select1st,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>const,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>>,std::allocator<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>const,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>>>,std::__detail::_Select1st,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                ((_Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>const,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>>,std::allocator<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>const,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>>>,std::__detail::_Select1st,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&this->continue_block_to_loop_header,
                 &(other->continue_block_to_loop_header)._M_h);
      ::std::
      _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>const,diligent_spirv_cross::SPIREntryPoint>,std::allocator<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>const,diligent_spirv_cross::SPIREntryPoint>>,std::__detail::_Select1st,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>const,diligent_spirv_cross::SPIREntryPoint>,std::allocator<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>const,diligent_spirv_cross::SPIREntryPoint>>,std::__detail::_Select1st,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                ((_Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>const,diligent_spirv_cross::SPIREntryPoint>,std::allocator<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>const,diligent_spirv_cross::SPIREntryPoint>>,std::__detail::_Select1st,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&this->entry_points,&(other->entry_points)._M_h);
    }
    (this->default_entry_point).id = (other->default_entry_point).id;
    uVar1 = *(undefined4 *)((long)&(other->source).version + 3);
    (this->source).version = (other->source).version;
    *(undefined4 *)((long)&(this->source).version + 3) = uVar1;
    this->loop_iteration_depth_hard = other->loop_iteration_depth_hard;
    this->loop_iteration_depth_soft = other->loop_iteration_depth_soft;
    this->addressing_model = other->addressing_model;
    this->memory_model = other->memory_model;
    if (other != this) {
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&this->meta_needing_name_fixup,&(other->meta_needing_name_fixup)._M_h);
      ::std::
      _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>const,unsigned_int>,std::allocator<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>const,unsigned_int>,std::allocator<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                ((_Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>const,unsigned_int>,std::allocator<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&this->load_type_width,&(other->load_type_width)._M_h);
    }
    this_00 = &this->ids;
    SmallVector<diligent_spirv_cross::Variant,_8UL>::clear(this_00);
    SmallVector<diligent_spirv_cross::Variant,_8UL>::reserve
              (this_00,(other->ids).super_VectorView<diligent_spirv_cross::Variant>.buffer_size);
    if ((other->ids).super_VectorView<diligent_spirv_cross::Variant>.buffer_size != 0) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        _Var2._M_head_impl =
             (this->pool_group)._M_t.
             super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolGroup,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
             ._M_t.
             super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_std::default_delete<diligent_spirv_cross::ObjectPoolGroup>_>
             .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
        SmallVector<diligent_spirv_cross::Variant,_8UL>::reserve
                  (this_00,(this->ids).super_VectorView<diligent_spirv_cross::Variant>.buffer_size +
                           1);
        sVar3 = (this->ids).super_VectorView<diligent_spirv_cross::Variant>.buffer_size;
        this_01 = (this->ids).super_VectorView<diligent_spirv_cross::Variant>.ptr + sVar3;
        this_01->group = _Var2._M_head_impl;
        this_01->holder = (IVariant *)0x0;
        this_01->type = TypeNone;
        this_01->allow_type_rewrite = false;
        (this->ids).super_VectorView<diligent_spirv_cross::Variant>.buffer_size = sVar3 + 1;
        Variant::operator=(this_01,(Variant *)
                                   ((long)&((other->ids).
                                            super_VectorView<diligent_spirv_cross::Variant>.ptr)->
                                           group + lVar5));
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x18;
      } while (uVar4 < (other->ids).super_VectorView<diligent_spirv_cross::Variant>.buffer_size);
    }
  }
  return this;
}

Assistant:

ParsedIR &ParsedIR::operator=(const ParsedIR &other)
{
	if (this != &other)
	{
		spirv = other.spirv;
		meta = other.meta;
		for (int i = 0; i < TypeCount; i++)
			ids_for_type[i] = other.ids_for_type[i];
		ids_for_constant_undef_or_type = other.ids_for_constant_undef_or_type;
		ids_for_constant_or_variable = other.ids_for_constant_or_variable;
		declared_capabilities = other.declared_capabilities;
		declared_extensions = other.declared_extensions;
		block_meta = other.block_meta;
		continue_block_to_loop_header = other.continue_block_to_loop_header;
		entry_points = other.entry_points;
		default_entry_point = other.default_entry_point;
		source = other.source;
		loop_iteration_depth_hard = other.loop_iteration_depth_hard;
		loop_iteration_depth_soft = other.loop_iteration_depth_soft;
		addressing_model = other.addressing_model;
		memory_model = other.memory_model;


		meta_needing_name_fixup = other.meta_needing_name_fixup;
		load_type_width = other.load_type_width;

		// Very deliberate copying of IDs. There is no default copy constructor, nor a simple default constructor.
		// Construct object first so we have the correct allocator set-up, then we can copy object into our new pool group.
		ids.clear();
		ids.reserve(other.ids.size());
		for (size_t i = 0; i < other.ids.size(); i++)
		{
			ids.emplace_back(pool_group.get());
			ids.back() = other.ids[i];
		}
	}
	return *this;
}